

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>>::
find<0ul,char_const(&)[7]>
          (Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *this,
          char (*params) [7])

{
  uint uVar1;
  StringCompare *this_00;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  size_t in_R8;
  StringPtr a;
  StringPtr b;
  Iterator iter;
  Iterator IStack_68;
  long local_50;
  long local_48;
  SearchKey local_40;
  Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *local_38;
  long *local_30;
  char (*local_28) [7];
  
  local_38 = this + 0x20;
  local_50 = *(long *)this;
  local_48 = *(long *)(this + 8) - local_50 >> 4;
  local_30 = &local_50;
  local_40._vptr_SearchKey = (_func_int **)&PTR_search_001c6ad8;
  local_28 = params;
  _::BTreeImpl::search(&IStack_68,(BTreeImpl *)(this + 0x28),&local_40);
  if (((ulong)IStack_68.row != 0xe) && (uVar1 = (IStack_68.leaf)->rows[IStack_68.row].i, uVar1 != 0)
     ) {
    lVar4 = (ulong)(uVar1 - 1) * 0x10;
    this_00 = *(StringCompare **)(local_50 + lVar4);
    pcVar2 = *(char **)(local_50 + 8 + lVar4);
    sVar5 = strlen(*params);
    a.content.size_ = (size_t)params;
    a.content.ptr = pcVar2;
    b.content.size_ = in_R8;
    b.content.ptr = (char *)(sVar5 + 1);
    bVar3 = _::anon_unknown_0::StringCompare::matches(this_00,a,b);
    if (bVar3) {
      return (Maybe<kj::StringPtr_&>)
             (StringPtr *)
             ((ulong)((IStack_68.leaf)->rows[IStack_68.row].i - 1) * 0x10 + *(long *)this);
    }
  }
  return (Maybe<kj::StringPtr_&>)(StringPtr *)0x0;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_MAYBE(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[*pos];
  } else {
    return nullptr;
  }
}